

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

void __thiscall ast::Dir_section::Dir_section(Dir_section *this,string *name,Location left)

{
  Location l;
  string local_68;
  char *local_38;
  int iStack_30;
  int iStack_2c;
  int local_28;
  undefined4 uStack_24;
  string *local_18;
  string *name_local;
  Dir_section *this_local;
  
  l = left;
  local_28 = left.last_column;
  uStack_24 = left._20_4_;
  local_38 = left.unit;
  iStack_30 = left.line;
  iStack_2c = left.first_column;
  local_18 = name;
  name_local = (string *)this;
  Directive::Directive(&this->super_Directive,l);
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_section_0017e810
  ;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  Sections::set_section(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset =
       *(uint *)(Sections::current_section + 0x30);
  (this->super_Directive).super_Statement.size_in_memory = 0;
  return;
}

Assistant:

Dir_section::Dir_section(string name, Location left) :
	Directive {left}, name {name}
{
	Sections::set_section(name);
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	size_in_memory = 0;
}